

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# int_helper.c
# Opt level: O3

target_ulong helper_divs_ppc64(CPUPPCState_conflict2 *env,target_ulong arg1,target_ulong arg2)

{
  ulong uVar1;
  target_ulong tVar2;
  int iVar3;
  target_ulong tVar4;
  
  iVar3 = (int)arg2;
  tVar4 = 0;
  tVar2 = 0xffffffff80000000;
  if ((iVar3 != 0) && (iVar3 != -1 || (int)arg1 != -0x80000000)) {
    uVar1 = (ulong)(uint)((int)arg1 >> 0x1f) << 0x20 | arg1 & 0xffffffff;
    tVar4 = (target_ulong)(int)((long)uVar1 % (long)iVar3);
    tVar2 = (target_ulong)(int)((long)uVar1 / (long)iVar3);
  }
  env->spr[0] = tVar4;
  return tVar2;
}

Assistant:

target_ulong helper_divs(CPUPPCState *env, target_ulong arg1,
                         target_ulong arg2)
{
    if (((int32_t)arg1 == INT32_MIN && (int32_t)arg2 == (int32_t)-1) ||
        (int32_t)arg2 == 0) {
        env->spr[SPR_MQ] = 0;
        return INT32_MIN;
    } else {
        env->spr[SPR_MQ] = (int32_t)arg1 % (int32_t)arg2;
        return (int32_t)arg1 / (int32_t)arg2;
    }
}